

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O0

int io_file_read(lua_State *L,FILE *fp,int start)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  MSize in_EDX;
  FILE *in_RSI;
  long in_RDI;
  char *p;
  int nargs;
  int n;
  int ok;
  ErrMsg em;
  long in_stack_ffffffffffffffb8;
  FILE *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  bool bVar5;
  FILE *in_stack_ffffffffffffffd0;
  MSize in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  MSize MVar6;
  FILE *L_00;
  int local_4;
  
  iVar1 = (int)(*(long *)(in_RDI + 0x18) - *(long *)(in_RDI + 0x10) >> 3) - in_EDX;
  clearerr(in_RSI);
  if (iVar1 == 0) {
    MVar6 = in_EDX;
    iVar2 = io_file_readline((lua_State *)in_RSI,(FILE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                             in_stack_ffffffffffffffdc);
    in_EDX = MVar6 + 1;
  }
  else {
    luaL_checkstack((lua_State *)in_stack_ffffffffffffffc0,
                    (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(char *)0x18d794);
    iVar2 = 1;
    MVar6 = in_EDX;
    while( true ) {
      iVar3 = iVar1 + -1;
      bVar5 = iVar1 != 0 && iVar2 != 0;
      if (iVar1 == 0 || iVar2 == 0) break;
      em = (ErrMsg)in_stack_ffffffffffffffb8;
      iVar1 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
      if (*(int *)(*(long *)(in_RDI + 0x10) + 4 + (long)(int)in_EDX * 8) == -5) {
        uVar4 = (ulong)*(uint *)(*(long *)(in_RDI + 0x10) + (long)(int)in_EDX * 8);
        in_stack_ffffffffffffffd0 = (FILE *)(uVar4 + 0x10);
        if ((char)in_stack_ffffffffffffffd0->_flags != '*') {
          lj_err_arg((lua_State *)in_stack_ffffffffffffffc0,iVar1,em);
        }
        if (*(char *)(uVar4 + 0x11) == 'n') {
          iVar2 = io_file_readnum((lua_State *)CONCAT17(bVar5,in_stack_ffffffffffffffc8),
                                  (FILE *)in_stack_ffffffffffffffc0);
        }
        else if ((*(byte *)(uVar4 + 0x11) & 0xdf) == 0x4c) {
          iVar2 = io_file_readline((lua_State *)in_RSI,(FILE *)CONCAT44(MVar6,iVar2),in_EDX);
        }
        else {
          if (*(char *)(uVar4 + 0x11) != 'a') {
            lj_err_arg((lua_State *)in_stack_ffffffffffffffc0,iVar1,em);
          }
          io_file_readall((lua_State *)CONCAT44(in_EDX,iVar3),in_stack_ffffffffffffffd0);
        }
      }
      else {
        if (0xfffeffff < *(uint *)(*(long *)(in_RDI + 0x10) + 4 + (long)(int)in_EDX * 8)) {
          lj_err_arg((lua_State *)in_stack_ffffffffffffffc0,iVar1,em);
        }
        in_stack_ffffffffffffffb8 = in_RDI;
        L_00 = in_RSI;
        lj_lib_checkint((lua_State *)CONCAT17(bVar5,in_stack_ffffffffffffffc8),
                        (int)((ulong)in_RSI >> 0x20));
        iVar2 = io_file_readlen((lua_State *)L_00,(FILE *)CONCAT44(MVar6,iVar2),in_EDX);
        in_stack_ffffffffffffffc0 = in_RSI;
        in_RSI = L_00;
      }
      in_EDX = in_EDX + 1;
      iVar1 = iVar3;
    }
  }
  iVar1 = ferror(in_RSI);
  if (iVar1 == 0) {
    if (iVar2 == 0) {
      *(undefined4 *)(*(long *)(in_RDI + 0x18) + -4) = 0xffffffff;
    }
    local_4 = in_EDX - MVar6;
  }
  else {
    local_4 = luaL_fileresult((lua_State *)CONCAT44(MVar6,iVar2),in_EDX,
                              (char *)in_stack_ffffffffffffffd0);
  }
  return local_4;
}

Assistant:

static int io_file_read(lua_State *L, FILE *fp, int start)
{
  int ok, n, nargs = (int)(L->top - L->base) - start;
  clearerr(fp);
  if (nargs == 0) {
    ok = io_file_readline(L, fp, 1);
    n = start+1;  /* Return 1 result. */
  } else {
    /* The results plus the buffers go on top of the args. */
    luaL_checkstack(L, nargs+LUA_MINSTACK, "too many arguments");
    ok = 1;
    for (n = start; nargs-- && ok; n++) {
      if (tvisstr(L->base+n)) {
	const char *p = strVdata(L->base+n);
	if (p[0] != '*')
	  lj_err_arg(L, n+1, LJ_ERR_INVOPT);
	if (p[1] == 'n')
	  ok = io_file_readnum(L, fp);
	else if ((p[1] & ~0x20) == 'L')
	  ok = io_file_readline(L, fp, (p[1] == 'l'));
	else if (p[1] == 'a')
	  io_file_readall(L, fp);
	else
	  lj_err_arg(L, n+1, LJ_ERR_INVFMT);
      } else if (tvisnumber(L->base+n)) {
	ok = io_file_readlen(L, fp, (MSize)lj_lib_checkint(L, n+1));
      } else {
	lj_err_arg(L, n+1, LJ_ERR_INVOPT);
      }
    }
  }
  if (ferror(fp))
    return luaL_fileresult(L, 0, NULL);
  if (!ok)
    setnilV(L->top-1);  /* Replace last result with nil. */
  return n - start;
}